

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

int isequal(attr *a,attr *b)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  int i;
  int depth2;
  int depth1;
  int d2 [10];
  int d1 [10];
  int local_84;
  int local_80;
  int local_7c;
  int aiStack_78 [12];
  int aiStack_48 [12];
  int *local_18;
  int *local_10;
  int local_4;
  
  if ((in_RDI == (int *)0x0) || (in_RSI == (int *)0x0)) {
    local_4 = 0;
  }
  else {
    local_7c = 0;
    local_80 = 0;
    local_18 = in_RSI;
    for (local_10 = in_RDI; *local_10 == 1; local_10 = (int *)**(undefined8 **)(local_10 + 2)) {
      aiStack_48[local_7c] = *(int *)(*(long *)(local_10 + 2) + 8);
      local_7c = local_7c + 1;
    }
    for (; *local_18 == 1; local_18 = (int *)**(undefined8 **)(local_18 + 2)) {
      aiStack_78[local_80] = *(int *)(*(long *)(local_18 + 2) + 8);
      local_80 = local_80 + 1;
    }
    if (local_7c == local_80) {
      for (local_84 = 0; local_84 < local_7c; local_84 = local_84 + 1) {
        if (aiStack_48[local_84] != aiStack_78[local_84]) {
          return 0;
        }
      }
      if (*local_10 == 3) {
        local_10 = *(int **)(*(long *)(local_10 + 2) + 8);
      }
      if (*local_18 == 3) {
        local_18 = *(int **)(*(long *)(local_18 + 2) + 8);
      }
      if (*local_10 == *local_18) {
        switch(*local_10) {
        case 0:
          if (*(int *)(*(long *)(local_10 + 2) + 8) != *(int *)(*(long *)(local_18 + 2) + 8)) {
            return 0;
          }
          break;
        case 1:
          break;
        case 2:
          iVar1 = strcmp((char *)**(undefined8 **)(local_10 + 2),
                         (char *)**(undefined8 **)(local_18 + 2));
          if (iVar1 != 0) {
            return 0;
          }
          break;
        case 3:
          break;
        default:
          abort();
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int isequal(struct attr *a, struct attr *b) {
    if (!a || !b)
        return 0;
    int d1[10], d2[10];
    int depth1 = 0, depth2 = 0;
    for (; a->kind == ARRAY; ++depth1) {
        d1[depth1] = a->array->size;
        a = a->array->type;
    }
    for (; b->kind == ARRAY; ++depth2) {
        d2[depth2] = b->array->size;
        b = b->array->type;
    }
    if (depth1 != depth2)
        return 0;
    int i;
    for (i = 0; i < depth1; ++i) {
        if (d1[i] != d2[i])
            return 0;
    }
    if (a->kind == FUNCTION)
        a = a->function->return_type;
    if (b->kind == FUNCTION) {
        b = b->function->return_type;
    }
    //DONETODO: check type equality
    if (a->kind != b->kind)
        return 0;
    switch (a->kind) {
        case BASIC:
            if (a->basic->type != b->basic->type)
                return 0;
            break;
        case STRUCTURE:
            if (strcmp(a->structure->name, b->structure->name) != 0) {
                return 0;
            }
            break;
        case ARRAY:
            break;
        case FUNCTION:
            break;
        default:
            abort();
    }
    return 1;
}